

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

Id __thiscall
anon_unknown.dwarf_deef1e::TGlslangToSpvTraverser::createBinaryOperation
          (TGlslangToSpvTraverser *this,TOperator op,OpDecorations *decorations,Id typeId,Id left,
          Id right,TBasicType typeProxy,bool reduceComparison)

{
  pointer ppIVar1;
  bool bVar2;
  uint right_00;
  OpDecorations *pOVar3;
  Op OVar4;
  Id IVar5;
  uint uVar6;
  uint uVar7;
  Id IVar8;
  Id right_01;
  Instruction *pIVar9;
  Instruction *pIVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  Decoration decoration;
  ulong uVar14;
  Id IVar15;
  Builder *pBVar16;
  Op OVar17;
  bool bVar18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> results;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  uint local_c0;
  uint local_bc;
  OpDecorations *local_b8;
  Id local_ac;
  Op local_a8;
  uint local_a4;
  ulong local_a0;
  Id local_94;
  Builder *local_90;
  ulong local_88;
  Id local_7c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  ulong local_40;
  TGlslangToSpvTraverser *local_38;
  
  uVar7 = typeProxy - EbtUint8;
  uVar6 = typeProxy - EbtFloat;
  OVar4 = OpNop;
  bVar2 = true;
  bVar18 = false;
  local_c0 = right;
  local_bc = left;
  local_b8 = decorations;
  if (0x1df < (int)op) {
    switch(op) {
    case EOpAddAssign:
      goto switchD_003be1a9_caseD_19;
    case EOpSubAssign:
      goto switchD_003be1a9_caseD_1a;
    case EOpMulAssign:
      goto switchD_003be1a9_caseD_1b;
    case EOpVectorTimesMatrixAssign:
      goto switchD_003be1a9_caseD_2d;
    case EOpVectorTimesScalarAssign:
      goto switchD_003be1a9_caseD_2c;
    case EOpMatrixTimesScalarAssign:
      goto switchD_003be1a9_caseD_2f;
    case EOpMatrixTimesMatrixAssign:
switchD_003be1cf_caseD_1e6:
      OVar17 = OpMatrixTimesMatrix;
      goto LAB_003be5aa;
    case EOpDivAssign:
      goto switchD_003be1a9_caseD_1c;
    case EOpModAssign:
      goto switchD_003be1a9_caseD_1d;
    case EOpAndAssign:
      goto switchD_003be1a9_caseD_20;
    case EOpInclusiveOrAssign:
      goto switchD_003be1a9_caseD_21;
    case EOpExclusiveOrAssign:
      goto switchD_003be1a9_caseD_22;
    case EOpLeftShiftAssign:
      goto switchD_003be1a9_caseD_1f;
    case EOpRightShiftAssign:
      goto switchD_003be1a9_caseD_1e;
    default:
      switch(op) {
      case EOpAbsDifference:
        bVar18 = false;
        OVar17 = ((uVar7 & 0xfffffff9) == 0) + OpAbsISubINTEL;
        break;
      case EOpAddSaturate:
        bVar18 = false;
        OVar17 = ((uVar7 & 0xfffffff9) == 0) + OpIAddSatINTEL;
        break;
      case EOpSubSaturate:
        bVar18 = false;
        OVar17 = ((uVar7 & 0xfffffff9) == 0) + OpISubSatINTEL;
        break;
      case EOpAverage:
        bVar18 = false;
        OVar17 = ((uVar7 & 0xfffffff9) == 0) + OpIAverageINTEL;
        break;
      case EOpAverageRounded:
        bVar18 = false;
        OVar17 = ((uVar7 & 0xfffffff9) == 0) + OpIAverageRoundedINTEL;
        break;
      case EOpMul32x16:
        bVar18 = false;
        OVar17 = ((uVar7 & 0xfffffff9) == 0) + OpIMul32x16INTEL;
        break;
      default:
        OVar17 = OVar4;
        if (op == EOpExpectEXT) {
          OVar17 = OpExpectKHR;
          goto LAB_003be5aa;
        }
      }
    }
    goto switchD_003be1a9_caseD_2b;
  }
  OVar17 = OpNop;
  bVar18 = false;
  switch(op) {
  case EOpAdd:
switchD_003be1a9_caseD_19:
    bVar18 = false;
    OVar17 = (uVar6 < 3) + OpIAdd;
    goto switchD_003be1a9_caseD_2b;
  case EOpSub:
switchD_003be1a9_caseD_1a:
    bVar18 = false;
    OVar17 = (uVar6 < 3) + OpISub;
    goto switchD_003be1a9_caseD_2b;
  case EOpMul:
switchD_003be1a9_caseD_1b:
    bVar18 = false;
    OVar17 = (uVar6 < 3) + OpIMul;
    goto switchD_003be1a9_caseD_2b;
  case EOpDiv:
switchD_003be1a9_caseD_1c:
    OVar4 = OpSDiv - ((uVar7 & 0xfffffff9) == 0);
    OVar17 = OpFDiv;
    goto LAB_003be2c1;
  case EOpMod:
switchD_003be1a9_caseD_1d:
    bVar18 = (uVar7 & 0xfffffff9) != 0;
    OVar4 = bVar18 + 0x89 + (uint)bVar18;
    OVar17 = OpFMod;
LAB_003be2c1:
    if (2 < uVar6) {
      OVar17 = OVar4;
    }
    break;
  case EOpRightShift:
switchD_003be1a9_caseD_1e:
    OVar17 = OpShiftRightArithmetic - ((uVar7 & 0xfffffff9) == 0);
    break;
  case EOpLeftShift:
switchD_003be1a9_caseD_1f:
    OVar17 = OpShiftLeftLogical;
    break;
  case EOpAnd:
switchD_003be1a9_caseD_20:
    OVar17 = OpBitwiseAnd;
    break;
  case EOpInclusiveOr:
switchD_003be1a9_caseD_21:
    OVar17 = OpBitwiseOr;
    break;
  case EOpExclusiveOr:
switchD_003be1a9_caseD_22:
    OVar17 = OpBitwiseXor;
    break;
  case EOpEqual:
  case EOpNotEqual:
  case EOpVectorEqual:
  case EOpVectorNotEqual:
  case EOpLessThan:
  case EOpGreaterThan:
  case EOpLessThanEqual:
  case EOpGreaterThanEqual:
    bVar18 = true;
    bVar2 = true;
    OVar17 = OVar4;
  case EOpComma:
    goto switchD_003be1a9_caseD_2b;
  case EOpVectorTimesScalar:
switchD_003be1a9_caseD_2c:
    if (uVar6 < 3) {
      ppIVar1 = (this->builder).module.idToInstruction.
                super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pIVar10 = ppIVar1[left];
      if (pIVar10 == (Instruction *)0x0) {
        uVar11 = 0;
      }
      else {
        uVar11 = (ulong)pIVar10->typeId;
      }
      if (ppIVar1[uVar11]->opCode != OpTypeVector) {
        pIVar9 = ppIVar1[right];
        if (pIVar9 == (Instruction *)0x0) {
          uVar11 = 0;
        }
        else {
          uVar11 = (ulong)pIVar9->typeId;
        }
        if (ppIVar1[uVar11]->opCode != OpTypeVector) {
          if (pIVar10 == (Instruction *)0x0) {
            uVar11 = 0;
          }
          else {
            uVar11 = (ulong)pIVar10->typeId;
          }
          if (ppIVar1[uVar11]->opCode != OpTypeCooperativeVectorNV) {
            if (pIVar9 == (Instruction *)0x0) {
              uVar11 = 0;
            }
            else {
              uVar11 = (ulong)pIVar9->typeId;
            }
            if (ppIVar1[uVar11]->opCode != OpTypeCooperativeVectorNV) {
              OVar17 = OpFMul;
              break;
            }
          }
        }
      }
      pIVar10 = ppIVar1[right];
      if (pIVar10 == (Instruction *)0x0) {
        uVar11 = 0;
      }
      else {
        uVar11 = (ulong)pIVar10->typeId;
      }
      if (ppIVar1[uVar11]->opCode == OpTypeVector) {
LAB_003bef6b:
        local_c0 = left;
        local_bc = right;
      }
      else {
        if (pIVar10 == (Instruction *)0x0) {
          uVar11 = 0;
        }
        else {
          uVar11 = (ulong)pIVar10->typeId;
        }
        if (ppIVar1[uVar11]->opCode == OpTypeCooperativeVectorNV) goto LAB_003bef6b;
      }
      if (ppIVar1[local_c0] == (Instruction *)0x0) {
        uVar11 = 0;
      }
      else {
        uVar11 = (ulong)ppIVar1[local_c0]->typeId;
      }
      if (2 < ppIVar1[uVar11]->opCode - OpTypeBool) {
        __assert_fail("builder.isScalar(right)",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                      ,0x1bba,
                      "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryOperation(glslang::TOperator, OpDecorations &, spv::Id, spv::Id, spv::Id, glslang::TBasicType, bool)"
                     );
      }
      OVar17 = OpVectorTimesScalar;
      goto LAB_003befa2;
    }
    ppIVar1 = (this->builder).module.idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppIVar1[left] == (Instruction *)0x0) {
      uVar11 = 0;
    }
    else {
      uVar11 = (ulong)ppIVar1[left]->typeId;
    }
    if (ppIVar1[uVar11]->opCode != OpTypeCooperativeVectorNV) {
      if (ppIVar1[right] == (Instruction *)0x0) {
        uVar11 = 0;
      }
      else {
        uVar11 = (ulong)ppIVar1[right]->typeId;
      }
      if (ppIVar1[uVar11]->opCode != OpTypeCooperativeVectorNV) {
        OVar17 = OpIMul;
        break;
      }
    }
    if (ppIVar1[right] == (Instruction *)0x0) {
      uVar11 = 0;
    }
    else {
      uVar11 = (ulong)ppIVar1[right]->typeId;
    }
    if (ppIVar1[uVar11]->opCode == OpTypeCooperativeVectorNV) {
      local_c0 = left;
      local_bc = right;
    }
    local_a0 = (ulong)local_c0;
    if (ppIVar1[local_a0] == (Instruction *)0x0) {
      uVar11 = 0;
    }
    else {
      uVar11 = (ulong)ppIVar1[local_a0]->typeId;
    }
    if (2 < ppIVar1[uVar11]->opCode - OpTypeBool) {
      __assert_fail("builder.isScalar(right)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1bc2,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryOperation(glslang::TOperator, OpDecorations &, spv::Id, spv::Id, spv::Id, glslang::TBasicType, bool)"
                   );
    }
    local_90 = &this->builder;
    if (ppIVar1[local_bc] == (Instruction *)0x0) {
      local_a8 = 0;
    }
    else {
      local_a8 = ppIVar1[local_bc]->typeId;
    }
    local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_ac = typeId;
    local_38 = this;
    local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(4);
    local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start + 1;
    *local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_start = (uint)local_a0;
    local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_c0 = spv::Builder::createCompositeConstruct(local_90,local_a8,&local_78);
    if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    bVar18 = false;
    this = local_38;
    typeId = local_ac;
    OVar17 = OpIMul;
    goto switchD_003be1a9_caseD_2b;
  case EOpVectorTimesMatrix:
switchD_003be1a9_caseD_2d:
    OVar17 = OpVectorTimesMatrix;
    break;
  case EOpMatrixTimesVector:
    OVar17 = OpMatrixTimesVector;
    break;
  case EOpMatrixTimesScalar:
switchD_003be1a9_caseD_2f:
    OVar17 = OpMatrixTimesScalar;
    break;
  case EOpLogicalOr:
    OVar17 = OpLogicalOr;
    goto LAB_003befa2;
  case EOpLogicalXor:
    OVar17 = OpLogicalNotEqual;
    goto LAB_003befa2;
  case EOpLogicalAnd:
    OVar17 = OpLogicalAnd;
LAB_003befa2:
    bVar18 = false;
    bVar2 = false;
    goto switchD_003be1a9_caseD_2b;
  default:
    if (op == EOpMatrixTimesMatrix) goto switchD_003be1cf_caseD_1e6;
    OVar17 = OVar4;
    if (op == EOpOuterProduct) {
      OVar17 = OpOuterProduct;
      goto LAB_003befa2;
    }
    goto switchD_003be1a9_caseD_2b;
  }
LAB_003be5aa:
  bVar18 = false;
switchD_003be1a9_caseD_2b:
  pOVar3 = local_b8;
  right_00 = local_c0;
  if (OVar17 == OpNop) {
    if (!bVar18) {
      return 0;
    }
    if ((!reduceComparison) || (1 < op - EOpEqual)) goto code_r0x003bedea;
    ppIVar1 = (this->builder).module.idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pIVar10 = ppIVar1[local_bc];
    if (pIVar10 == (Instruction *)0x0) {
      uVar11 = 0;
    }
    else {
      uVar11 = (ulong)pIVar10->typeId;
    }
    if (ppIVar1[uVar11]->opCode == OpTypeVector) {
LAB_003beb70:
      IVar5 = spv::Builder::createCompositeCompare
                        (&this->builder,local_b8->precision,local_bc,local_c0,op == EOpEqual);
      decoration = pOVar3->nonUniform;
      goto LAB_003be8e7;
    }
    if (pIVar10 == (Instruction *)0x0) {
      uVar11 = 0;
    }
    else {
      uVar11 = (ulong)pIVar10->typeId;
    }
    if (ppIVar1[uVar11]->opCode == OpTypeMatrix) goto LAB_003beb70;
    if (pIVar10 == (Instruction *)0x0) {
      uVar11 = 0;
    }
    else {
      uVar11 = (ulong)pIVar10->typeId;
    }
    OVar4 = ppIVar1[uVar11]->opCode;
    if ((int)OVar4 < 0x1168) {
      if ((OVar4 == OpTypeArray) || (OVar4 == OpTypeStruct)) goto LAB_003beb70;
    }
    else if ((OVar4 == OpTypeCooperativeMatrixNV) || (OVar4 == OpTypeCooperativeMatrixKHR))
    goto LAB_003beb70;
code_r0x003bedea:
    switch(op) {
    case EOpEqual:
    case EOpVectorEqual:
      OVar17 = OpIEqual;
      if (typeProxy == EbtBool) {
        OVar17 = OpLogicalEqual;
      }
      OVar4 = OpFOrdEqual;
      goto LAB_003bee30;
    case EOpNotEqual:
    case EOpVectorNotEqual:
      OVar17 = OpINotEqual;
      if (typeProxy == EbtBool) {
        OVar17 = OpLogicalNotEqual;
      }
      OVar4 = OpFUnordNotEqual;
LAB_003bee30:
      if (2 < uVar6) {
        OVar4 = OVar17;
      }
      goto LAB_003bee9a;
    case EOpLessThan:
      OVar17 = OpSLessThan - ((uVar7 & 0xfffffff9) == 0);
      OVar4 = OpFOrdLessThan;
      break;
    case EOpGreaterThan:
      OVar17 = OpSGreaterThan - ((uVar7 & 0xfffffff9) == 0);
      OVar4 = OpFOrdGreaterThan;
      break;
    case EOpLessThanEqual:
      OVar17 = OpSLessThanEqual - ((uVar7 & 0xfffffff9) == 0);
      OVar4 = OpFOrdLessThanEqual;
      break;
    case EOpGreaterThanEqual:
      OVar17 = OpSGreaterThanEqual - ((uVar7 & 0xfffffff9) == 0);
      OVar4 = OpFOrdGreaterThanEqual;
      break;
    default:
      bVar2 = true;
      OVar4 = OpNop;
      goto LAB_003bee9c;
    }
    if (2 < uVar6) {
      OVar4 = OVar17;
    }
LAB_003bee9a:
    bVar2 = false;
LAB_003bee9c:
    if (bVar2) {
      return 0;
    }
    pBVar16 = &this->builder;
    IVar5 = spv::Builder::createBinOp(pBVar16,OVar4,typeId,local_bc,local_c0);
    pOVar3 = local_b8;
    spv::Builder::addDecoration(pBVar16,IVar5,local_b8->noContraction,-1);
    spv::Builder::addDecoration(pBVar16,IVar5,pOVar3->nonUniform,-1);
    decoration = pOVar3->precision;
    if (IVar5 == 0 || decoration == DecorationMax) {
      return IVar5;
    }
    goto LAB_003be8e7;
  }
  if (bVar18) {
    __assert_fail("comparison == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x1c40,
                  "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryOperation(glslang::TOperator, OpDecorations &, spv::Id, spv::Id, spv::Id, glslang::TBasicType, bool)"
                 );
  }
  uVar11 = (ulong)local_bc;
  ppIVar1 = (this->builder).module.idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar10 = ppIVar1[uVar11];
  if (pIVar10 == (Instruction *)0x0) {
    uVar12 = 0;
  }
  else {
    uVar12 = (ulong)pIVar10->typeId;
  }
  pBVar16 = &this->builder;
  if (ppIVar1[uVar12]->opCode != OpTypeMatrix) {
    pIVar9 = ppIVar1[local_c0];
    if (pIVar9 == (Instruction *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)pIVar9->typeId;
    }
    if (ppIVar1[uVar12]->opCode == OpTypeMatrix) goto LAB_003be68e;
    if (pIVar10 == (Instruction *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)pIVar10->typeId;
    }
    if ((ppIVar1[uVar12]->opCode == OpTypeCooperativeMatrixKHR) ||
       (ppIVar1[uVar12]->opCode == OpTypeCooperativeMatrixNV)) goto LAB_003be68e;
    if (pIVar9 == (Instruction *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)pIVar9->typeId;
    }
    if ((ppIVar1[uVar12]->opCode == OpTypeCooperativeMatrixNV) ||
       (ppIVar1[uVar12]->opCode == OpTypeCooperativeMatrixKHR)) goto LAB_003be68e;
    if (bVar2) {
      spv::Builder::promoteScalar(pBVar16,local_b8->precision,&local_bc,&local_c0);
    }
    uVar12 = (ulong)local_c0;
    uVar7 = local_bc;
    goto LAB_003be89e;
  }
LAB_003be68e:
  uVar12 = (ulong)local_c0;
  bVar2 = false;
  switch(OVar17) {
  case OpFDiv:
    ppIVar1 = (this->builder).module.idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppIVar1[uVar11] == (Instruction *)0x0) {
      uVar13 = 0;
    }
    else {
      uVar13 = (ulong)ppIVar1[uVar11]->typeId;
    }
    OVar17 = OpFDiv;
    if (ppIVar1[uVar13]->opCode == OpTypeMatrix) {
      pIVar10 = ppIVar1[uVar12];
      if (pIVar10 == (Instruction *)0x0) {
        uVar13 = 0;
      }
      else {
        uVar13 = (ulong)pIVar10->typeId;
      }
      IVar5 = 0;
      bVar2 = false;
      if (ppIVar1[uVar13]->opCode - OpTypeBool < 3) {
        if (pIVar10 != (Instruction *)0x0) {
          IVar5 = pIVar10->typeId;
        }
        IVar8 = spv::Builder::makeFpConstant(pBVar16,IVar5,1.0,false);
        IVar5 = spv::Builder::createBinOp(pBVar16,OpFDiv,IVar5,IVar8,right_00);
        uVar12 = (ulong)IVar5;
        OVar17 = OpMatrixTimesScalar;
        bVar2 = true;
      }
    }
    else {
      bVar2 = false;
    }
    break;
  case OpMatrixTimesScalar:
    ppIVar1 = (this->builder).module.idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pIVar10 = ppIVar1[uVar12];
    if (pIVar10 == (Instruction *)0x0) {
      uVar13 = 0;
    }
    else {
      uVar13 = (ulong)pIVar10->typeId;
    }
    uVar14 = uVar12;
    if (ppIVar1[uVar13]->opCode != OpTypeMatrix) {
      if (pIVar10 == (Instruction *)0x0) {
        uVar13 = 0;
      }
      else {
        uVar13 = (ulong)pIVar10->typeId;
      }
      if ((ppIVar1[uVar13]->opCode != OpTypeCooperativeMatrixNV) &&
         (ppIVar1[uVar13]->opCode != OpTypeCooperativeMatrixKHR)) {
        uVar14 = uVar11;
        uVar11 = uVar12;
      }
    }
    uVar12 = uVar11;
    if (ppIVar1[uVar12] == (Instruction *)0x0) {
      uVar11 = 0;
    }
    else {
      uVar11 = (ulong)ppIVar1[uVar12]->typeId;
    }
    if (2 < ppIVar1[uVar11]->opCode - OpTypeBool) {
      __assert_fail("builder.isScalar(right)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cbd,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    OVar17 = OpMatrixTimesScalar;
    bVar2 = true;
    uVar11 = uVar14;
    break;
  case OpVectorTimesMatrix:
    ppIVar1 = (this->builder).module.idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppIVar1[uVar11] == (Instruction *)0x0) {
      uVar13 = 0;
    }
    else {
      uVar13 = (ulong)ppIVar1[uVar11]->typeId;
    }
    if (ppIVar1[uVar13]->opCode != OpTypeVector) {
      __assert_fail("builder.isVector(left)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cc0,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    if (ppIVar1[uVar12] == (Instruction *)0x0) {
      uVar13 = 0;
    }
    else {
      uVar13 = (ulong)ppIVar1[uVar12]->typeId;
    }
    if (ppIVar1[uVar13]->opCode != OpTypeMatrix) {
      __assert_fail("builder.isMatrix(right)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cc1,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    OVar17 = OpVectorTimesMatrix;
    goto LAB_003be831;
  case OpMatrixTimesVector:
    ppIVar1 = (this->builder).module.idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppIVar1[uVar11] == (Instruction *)0x0) {
      uVar13 = 0;
    }
    else {
      uVar13 = (ulong)ppIVar1[uVar11]->typeId;
    }
    if (ppIVar1[uVar13]->opCode != OpTypeMatrix) {
      __assert_fail("builder.isMatrix(left)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cc4,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    if (ppIVar1[uVar12] == (Instruction *)0x0) {
      uVar13 = 0;
    }
    else {
      uVar13 = (ulong)ppIVar1[uVar12]->typeId;
    }
    if (ppIVar1[uVar13]->opCode != OpTypeVector) {
      __assert_fail("builder.isVector(right)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cc5,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    OVar17 = OpMatrixTimesVector;
    goto LAB_003be831;
  case OpMatrixTimesMatrix:
    ppIVar1 = (this->builder).module.idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppIVar1[uVar11] == (Instruction *)0x0) {
      uVar13 = 0;
    }
    else {
      uVar13 = (ulong)ppIVar1[uVar11]->typeId;
    }
    if (ppIVar1[uVar13]->opCode != OpTypeMatrix) {
      __assert_fail("builder.isMatrix(left)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cc8,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    if (ppIVar1[uVar12] == (Instruction *)0x0) {
      uVar13 = 0;
    }
    else {
      uVar13 = (ulong)ppIVar1[uVar12]->typeId;
    }
    if (ppIVar1[uVar13]->opCode != OpTypeMatrix) {
      __assert_fail("builder.isMatrix(right)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1cc9,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                   );
    }
    OVar17 = OpMatrixTimesMatrix;
LAB_003be831:
    bVar2 = true;
  }
  uVar7 = (uint)uVar11;
  ppIVar1 = (this->builder).module.idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar10 = ppIVar1[uVar11];
  if (pIVar10 == (Instruction *)0x0) {
    uVar13 = 0;
  }
  else {
    uVar13 = (ulong)pIVar10->typeId;
  }
  if ((ppIVar1[uVar13]->opCode != OpTypeCooperativeMatrixKHR) &&
     (ppIVar1[uVar13]->opCode != OpTypeCooperativeMatrixNV)) {
    pIVar9 = ppIVar1[uVar12];
    if (pIVar9 == (Instruction *)0x0) {
      uVar13 = 0;
    }
    else {
      uVar13 = (ulong)pIVar9->typeId;
    }
    if (((!bVar2) && (ppIVar1[uVar13]->opCode != OpTypeCooperativeMatrixNV)) &&
       (ppIVar1[uVar13]->opCode != OpTypeCooperativeMatrixKHR)) {
      local_88 = uVar12;
      if ((0xc < OVar17 - OpFAdd) || ((0x1095U >> (OVar17 - OpFAdd & 0x1f) & 1) == 0)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                      ,0x1d08,
                      "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createBinaryMatrixOperation(spv::Op, OpDecorations &, spv::Id, spv::Id, spv::Id)"
                     );
      }
      if (pIVar10 == (Instruction *)0x0) {
        uVar13 = 0;
      }
      else {
        uVar13 = (ulong)pIVar10->typeId;
      }
      local_a0 = CONCAT44(local_a0._4_4_,ppIVar1[uVar13]->opCode);
      if (pIVar9 == (Instruction *)0x0) {
        uVar6 = 0;
      }
      else {
        uVar6 = pIVar9->typeId;
      }
      if (ppIVar1[uVar13]->opCode == OpTypeMatrix) {
        pIVar9 = pIVar10;
        if (pIVar10 == (Instruction *)0x0) goto LAB_003bea90;
LAB_003bea9f:
        IVar5 = pIVar9->typeId;
      }
      else {
        if (pIVar9 != (Instruction *)0x0) goto LAB_003bea9f;
LAB_003bea90:
        IVar5 = 0;
      }
      local_a8 = ppIVar1[uVar6]->opCode;
      local_ac = typeId;
      uVar6 = spv::Builder::getTypeNumColumns(pBVar16,IVar5);
      local_90 = (Builder *)CONCAT44(local_90._4_4_,uVar6);
      ppIVar1 = (this->builder).module.idToInstruction.
                super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((int)local_a0 == 0x18) {
        pIVar10 = ppIVar1[uVar11];
      }
      else {
        pIVar10 = ppIVar1[uVar12];
      }
      if (pIVar10 == (Instruction *)0x0) {
        IVar5 = 0;
      }
      else {
        IVar5 = pIVar10->typeId;
      }
      local_94 = uVar7;
      local_40 = uVar12;
      uVar7 = spv::Builder::getTypeNumRows(pBVar16,IVar5);
      IVar5 = spv::Builder::getScalarTypeId(pBVar16,local_ac);
      IVar5 = spv::Builder::makeVectorType(pBVar16,IVar5,uVar7);
      local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      ppIVar1 = (this->builder).module.idToInstruction.
                super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppIVar1[uVar11] == (Instruction *)0x0) {
        uVar11 = 0;
      }
      else {
        uVar11 = (ulong)ppIVar1[uVar11]->typeId;
      }
      IVar8 = local_94;
      if (2 < ppIVar1[uVar11]->opCode - OpTypeBool) {
        IVar15 = 0;
        if (ppIVar1[local_40] == (Instruction *)0x0) {
          uVar11 = 0;
        }
        else {
          uVar11 = (ulong)ppIVar1[local_40]->typeId;
        }
        IVar8 = (Id)local_88;
        if (2 < ppIVar1[uVar11]->opCode - OpTypeBool) goto LAB_003bebdc;
      }
      IVar15 = spv::Builder::smearScalar(pBVar16,local_b8->precision,IVar8,IVar5);
LAB_003bebdc:
      pOVar3 = local_b8;
      local_a4 = 0;
      if ((uint)local_90 != 0) {
        do {
          local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_58,(iterator)0x0,
                     &local_a4);
          IVar8 = IVar15;
          if ((int)local_a0 == 0x18) {
            IVar8 = spv::Builder::createCompositeExtract(pBVar16,local_94,IVar5,&local_58);
          }
          right_01 = IVar15;
          if (local_a8 == OpTypeMatrix) {
            right_01 = spv::Builder::createCompositeExtract(pBVar16,(Id)local_88,IVar5,&local_58);
          }
          IVar8 = spv::Builder::createBinOp(pBVar16,OVar17,IVar5,IVar8,right_01);
          spv::Builder::addDecoration(pBVar16,IVar8,pOVar3->noContraction,-1);
          spv::Builder::addDecoration(pBVar16,IVar8,pOVar3->nonUniform,-1);
          if (IVar8 != 0 && pOVar3->precision != DecorationMax) {
            spv::Builder::addDecoration(pBVar16,IVar8,pOVar3->precision,-1);
          }
          local_7c = IVar8;
          if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_78,
                       (iterator)
                       local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_7c);
          }
          else {
            *local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = IVar8;
            local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_58.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_58.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          local_a4 = local_a4 + 1;
        } while (local_a4 < (uint)local_90);
      }
      IVar5 = spv::Builder::createCompositeConstruct(pBVar16,local_ac,&local_78);
      if (IVar5 != 0 && local_b8->precision != DecorationMax) {
        spv::Builder::addDecoration(pBVar16,IVar5,local_b8->precision,-1);
      }
      spv::Builder::addDecoration(pBVar16,IVar5,local_b8->nonUniform,-1);
      if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        return IVar5;
      }
      operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      return IVar5;
    }
  }
LAB_003be89e:
  IVar5 = spv::Builder::createBinOp(pBVar16,OVar17,typeId,uVar7,(Id)uVar12);
  pOVar3 = local_b8;
  spv::Builder::addDecoration(pBVar16,IVar5,local_b8->noContraction,-1);
  spv::Builder::addDecoration(pBVar16,IVar5,pOVar3->nonUniform,-1);
  decoration = pOVar3->precision;
  if (IVar5 != 0 && decoration != DecorationMax) {
LAB_003be8e7:
    spv::Builder::addDecoration(&this->builder,IVar5,decoration,-1);
  }
  return IVar5;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createBinaryOperation(glslang::TOperator op, OpDecorations& decorations,
                                                      spv::Id typeId, spv::Id left, spv::Id right,
                                                      glslang::TBasicType typeProxy, bool reduceComparison)
{
    bool isUnsigned = isTypeUnsignedInt(typeProxy);
    bool isFloat = isTypeFloat(typeProxy);
    bool isBool = typeProxy == glslang::EbtBool;

    spv::Op binOp = spv::OpNop;
    bool needMatchingVectors = true;  // for non-matrix ops, would a scalar need to smear to match a vector?
    bool comparison = false;

    switch (op) {
    case glslang::EOpAdd:
    case glslang::EOpAddAssign:
        if (isFloat)
            binOp = spv::OpFAdd;
        else
            binOp = spv::OpIAdd;
        break;
    case glslang::EOpSub:
    case glslang::EOpSubAssign:
        if (isFloat)
            binOp = spv::OpFSub;
        else
            binOp = spv::OpISub;
        break;
    case glslang::EOpMul:
    case glslang::EOpMulAssign:
        if (isFloat)
            binOp = spv::OpFMul;
        else
            binOp = spv::OpIMul;
        break;
    case glslang::EOpVectorTimesScalar:
    case glslang::EOpVectorTimesScalarAssign:
        if (isFloat && (builder.isVector(left) || builder.isVector(right) || builder.isCooperativeVector(left) || builder.isCooperativeVector(right))) {
            if (builder.isVector(right) || builder.isCooperativeVector(right))
                std::swap(left, right);
            assert(builder.isScalar(right));
            needMatchingVectors = false;
            binOp = spv::OpVectorTimesScalar;
        } else if (isFloat) {
            binOp = spv::OpFMul;
        } else if (builder.isCooperativeVector(left) || builder.isCooperativeVector(right)) {
            if (builder.isCooperativeVector(right))
                std::swap(left, right);
            assert(builder.isScalar(right));
            // Construct a cooperative vector from the scalar
            right = builder.createCompositeConstruct(builder.getTypeId(left), { right });
            binOp = spv::OpIMul;
        } else {
            binOp = spv::OpIMul;
        }
        break;
    case glslang::EOpVectorTimesMatrix:
    case glslang::EOpVectorTimesMatrixAssign:
        binOp = spv::OpVectorTimesMatrix;
        break;
    case glslang::EOpMatrixTimesVector:
        binOp = spv::OpMatrixTimesVector;
        break;
    case glslang::EOpMatrixTimesScalar:
    case glslang::EOpMatrixTimesScalarAssign:
        binOp = spv::OpMatrixTimesScalar;
        break;
    case glslang::EOpMatrixTimesMatrix:
    case glslang::EOpMatrixTimesMatrixAssign:
        binOp = spv::OpMatrixTimesMatrix;
        break;
    case glslang::EOpOuterProduct:
        binOp = spv::OpOuterProduct;
        needMatchingVectors = false;
        break;

    case glslang::EOpDiv:
    case glslang::EOpDivAssign:
        if (isFloat)
            binOp = spv::OpFDiv;
        else if (isUnsigned)
            binOp = spv::OpUDiv;
        else
            binOp = spv::OpSDiv;
        break;
    case glslang::EOpMod:
    case glslang::EOpModAssign:
        if (isFloat)
            binOp = spv::OpFMod;
        else if (isUnsigned)
            binOp = spv::OpUMod;
        else
            binOp = spv::OpSMod;
        break;
    case glslang::EOpRightShift:
    case glslang::EOpRightShiftAssign:
        if (isUnsigned)
            binOp = spv::OpShiftRightLogical;
        else
            binOp = spv::OpShiftRightArithmetic;
        break;
    case glslang::EOpLeftShift:
    case glslang::EOpLeftShiftAssign:
        binOp = spv::OpShiftLeftLogical;
        break;
    case glslang::EOpAnd:
    case glslang::EOpAndAssign:
        binOp = spv::OpBitwiseAnd;
        break;
    case glslang::EOpLogicalAnd:
        needMatchingVectors = false;
        binOp = spv::OpLogicalAnd;
        break;
    case glslang::EOpInclusiveOr:
    case glslang::EOpInclusiveOrAssign:
        binOp = spv::OpBitwiseOr;
        break;
    case glslang::EOpLogicalOr:
        needMatchingVectors = false;
        binOp = spv::OpLogicalOr;
        break;
    case glslang::EOpExclusiveOr:
    case glslang::EOpExclusiveOrAssign:
        binOp = spv::OpBitwiseXor;
        break;
    case glslang::EOpLogicalXor:
        needMatchingVectors = false;
        binOp = spv::OpLogicalNotEqual;
        break;

    case glslang::EOpAbsDifference:
        binOp = isUnsigned ? spv::OpAbsUSubINTEL : spv::OpAbsISubINTEL;
        break;

    case glslang::EOpAddSaturate:
        binOp = isUnsigned ? spv::OpUAddSatINTEL : spv::OpIAddSatINTEL;
        break;

    case glslang::EOpSubSaturate:
        binOp = isUnsigned ? spv::OpUSubSatINTEL : spv::OpISubSatINTEL;
        break;

    case glslang::EOpAverage:
        binOp = isUnsigned ? spv::OpUAverageINTEL : spv::OpIAverageINTEL;
        break;

    case glslang::EOpAverageRounded:
        binOp = isUnsigned ? spv::OpUAverageRoundedINTEL : spv::OpIAverageRoundedINTEL;
        break;

    case glslang::EOpMul32x16:
        binOp = isUnsigned ? spv::OpUMul32x16INTEL : spv::OpIMul32x16INTEL;
        break;

    case glslang::EOpExpectEXT:
        binOp = spv::OpExpectKHR;
        break;

    case glslang::EOpLessThan:
    case glslang::EOpGreaterThan:
    case glslang::EOpLessThanEqual:
    case glslang::EOpGreaterThanEqual:
    case glslang::EOpEqual:
    case glslang::EOpNotEqual:
    case glslang::EOpVectorEqual:
    case glslang::EOpVectorNotEqual:
        comparison = true;
        break;
    default:
        break;
    }

    // handle mapped binary operations (should be non-comparison)
    if (binOp != spv::OpNop) {
        assert(comparison == false);
        if (builder.isMatrix(left) || builder.isMatrix(right) ||
            builder.isCooperativeMatrix(left) || builder.isCooperativeMatrix(right))
            return createBinaryMatrixOperation(binOp, decorations, typeId, left, right);

        // No matrix involved; make both operands be the same number of components, if needed
        if (needMatchingVectors)
            builder.promoteScalar(decorations.precision, left, right);

        spv::Id result = builder.createBinOp(binOp, typeId, left, right);
        decorations.addNoContraction(builder, result);
        decorations.addNonUniform(builder, result);
        return builder.setPrecision(result, decorations.precision);
    }

    if (! comparison)
        return 0;

    // Handle comparison instructions

    if (reduceComparison && (op == glslang::EOpEqual || op == glslang::EOpNotEqual)
                         && (builder.isVector(left) || builder.isMatrix(left) || builder.isAggregate(left))) {
        spv::Id result = builder.createCompositeCompare(decorations.precision, left, right, op == glslang::EOpEqual);
        decorations.addNonUniform(builder, result);
        return result;
    }

    switch (op) {
    case glslang::EOpLessThan:
        if (isFloat)
            binOp = spv::OpFOrdLessThan;
        else if (isUnsigned)
            binOp = spv::OpULessThan;
        else
            binOp = spv::OpSLessThan;
        break;
    case glslang::EOpGreaterThan:
        if (isFloat)
            binOp = spv::OpFOrdGreaterThan;
        else if (isUnsigned)
            binOp = spv::OpUGreaterThan;
        else
            binOp = spv::OpSGreaterThan;
        break;
    case glslang::EOpLessThanEqual:
        if (isFloat)
            binOp = spv::OpFOrdLessThanEqual;
        else if (isUnsigned)
            binOp = spv::OpULessThanEqual;
        else
            binOp = spv::OpSLessThanEqual;
        break;
    case glslang::EOpGreaterThanEqual:
        if (isFloat)
            binOp = spv::OpFOrdGreaterThanEqual;
        else if (isUnsigned)
            binOp = spv::OpUGreaterThanEqual;
        else
            binOp = spv::OpSGreaterThanEqual;
        break;
    case glslang::EOpEqual:
    case glslang::EOpVectorEqual:
        if (isFloat)
            binOp = spv::OpFOrdEqual;
        else if (isBool)
            binOp = spv::OpLogicalEqual;
        else
            binOp = spv::OpIEqual;
        break;
    case glslang::EOpNotEqual:
    case glslang::EOpVectorNotEqual:
        if (isFloat)
            binOp = spv::OpFUnordNotEqual;
        else if (isBool)
            binOp = spv::OpLogicalNotEqual;
        else
            binOp = spv::OpINotEqual;
        break;
    default:
        break;
    }

    if (binOp != spv::OpNop) {
        spv::Id result = builder.createBinOp(binOp, typeId, left, right);
        decorations.addNoContraction(builder, result);
        decorations.addNonUniform(builder, result);
        return builder.setPrecision(result, decorations.precision);
    }

    return 0;
}